

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O1

void __thiscall NJamSpell::TSpellCorrector::Inserts(TSpellCorrector *this,wstring *w,TWords *result)

{
  pointer *ppTVar1;
  iterator __position;
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  *puVar2;
  _Hash_node_base *p_Var3;
  wstring *pwVar4;
  ulong uVar5;
  ulong uVar6;
  undefined1 local_c8 [8];
  wstring s;
  ulong local_a0;
  undefined1 local_98 [16];
  _Hash_node_base *local_88;
  ulong *local_80;
  long local_78;
  ulong local_70 [2];
  TSpellCorrector *local_60;
  wstring *local_58;
  undefined1 auStack_50 [8];
  TWord c;
  
  if (w->_M_string_length != 0xffffffffffffffff) {
    uVar6 = 0;
    local_60 = this;
    local_58 = w;
    do {
      puVar2 = TLangModel::GetAlphabet(&local_60->LangModel);
      p_Var3 = (puVar2->_M_h)._M_before_begin._M_nxt;
      while (p_Var3 != (_Hash_node_base *)0x0) {
        std::__cxx11::wstring::substr((ulong)((long)&s.field_2 + 8),(ulong)w);
        local_88 = p_Var3;
        pwVar4 = (wstring *)
                 std::__cxx11::wstring::_M_replace_aux
                           ((ulong)((long)&s.field_2 + 8),local_a0,0,L'\x01');
        std::__cxx11::wstring::wstring((wstring *)auStack_50,pwVar4);
        std::__cxx11::wstring::substr((ulong)&local_80,(ulong)w);
        uVar5 = 3;
        if (auStack_50 != (undefined1  [8])&c.Len) {
          uVar5 = c.Len;
        }
        if (uVar5 < (ulong)(local_78 + (long)c.Ptr)) {
          uVar5 = 3;
          if (local_80 != local_70) {
            uVar5 = local_70[0];
          }
          if (uVar5 < (ulong)(local_78 + (long)c.Ptr)) goto LAB_00116c00;
          pwVar4 = (wstring *)
                   std::__cxx11::wstring::replace
                             ((ulong)&local_80,0,(wchar_t *)0x0,(ulong)auStack_50);
        }
        else {
LAB_00116c00:
          pwVar4 = (wstring *)
                   std::__cxx11::wstring::_M_append((wchar_t *)auStack_50,(ulong)local_80);
        }
        std::__cxx11::wstring::wstring((wstring *)local_c8,pwVar4);
        if (local_80 != local_70) {
          operator_delete(local_80);
        }
        if (auStack_50 != (undefined1  [8])&c.Len) {
          operator_delete((void *)auStack_50);
        }
        if ((undefined1 *)s.field_2._8_8_ != local_98) {
          operator_delete((void *)s.field_2._8_8_);
        }
        _auStack_50 = TLangModel::GetWord(&local_60->LangModel,(wstring *)local_c8);
        if (auStack_50._8_8_ != 0 && auStack_50 != (wchar_t *)0x0) {
          __position._M_current =
               (result->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (result->super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>>::
            _M_realloc_insert<NJamSpell::TWord_const&>
                      ((vector<NJamSpell::TWord,std::allocator<NJamSpell::TWord>> *)result,
                       __position,(TWord *)auStack_50);
          }
          else {
            *__position._M_current = _auStack_50;
            ppTVar1 = &(result->
                       super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppTVar1 = *ppTVar1 + 1;
          }
        }
        if (local_c8 != (undefined1  [8])&s._M_string_length) {
          operator_delete((void *)local_c8);
        }
        p_Var3 = local_88->_M_nxt;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < local_58->_M_string_length + 1);
  }
  return;
}

Assistant:

void TSpellCorrector::Inserts(const std::wstring& w, TWords& result) const {
    for (size_t i = 0; i < w.size() + 1; ++i) {
        for (auto&& ch: LangModel.GetAlphabet()) {
            std::wstring s = w.substr(0, i) + ch + w.substr(i);
            TWord c = LangModel.GetWord(s);
            if (c.Ptr && c.Len) {
                result.push_back(c);
            }
        }
    }
}